

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noccout.c
# Opt level: O3

void print_cuda_launcher_call(char *name)

{
  fputs("\n#if defined(ENABLE_CUDA_INTERFACE) && defined(_OPENACC) && !defined(DISABLE_OPENACC)\n",
        (FILE *)fcout);
  fputs("  NrnThread* d_nt = cnrn_target_deviceptr(_nt);\n",(FILE *)fcout);
  fputs("  Memb_list* d_ml = cnrn_target_deviceptr(_ml);\n",(FILE *)fcout);
  fprintf((FILE *)fcout,"  nrn_%s_launcher(d_nt, d_ml, _type, _cntml_actual);\n",name);
  fputs("  return;\n",(FILE *)fcout);
  fputs("#endif\n\n",(FILE *)fcout);
  return;
}

Assistant:

static void print_cuda_launcher_call(char *name) {
    P("\n#if defined(ENABLE_CUDA_INTERFACE) && defined(_OPENACC) && !defined(DISABLE_OPENACC)\n");
    P("  NrnThread* d_nt = cnrn_target_deviceptr(_nt);\n");
    P("  Memb_list* d_ml = cnrn_target_deviceptr(_ml);\n");
    Fprintf(fcout, "  nrn_%s_launcher(d_nt, d_ml, _type, _cntml_actual);\n", name);
    P("  return;\n");
    P("#endif\n\n");
}